

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

int update_it_envelope(IT_PLAYING *playing,IT_ENVELOPE *envelope,IT_PLAYING_ENVELOPE *pe,int flags)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  if (((uint)playing->enabled_envelopes & flags) == 0) {
    return 0;
  }
  bVar1 = envelope->n_nodes;
  if ((ulong)bVar1 == 0) {
    return 0;
  }
  uVar4 = pe->tick;
  if ((int)uVar4 < 1) {
    cVar2 = envelope->node_y[0];
  }
  else {
    if (uVar4 < envelope->node_t[bVar1 - 1]) {
      lVar8 = (long)pe->next_node;
      iVar7 = envelope->node_y[lVar8 + -1] * 0x100;
      uVar3 = envelope->node_t[lVar8 + -1];
      if (uVar3 != envelope->node_t[lVar8]) {
        iVar7 = iVar7 + (int)((uVar4 - uVar3) *
                              ((int)envelope->node_y[lVar8] - (int)envelope->node_y[lVar8 + -1]) *
                             0x100) / (int)((uint)envelope->node_t[lVar8] - (uint)uVar3);
      }
      goto LAB_005b6541;
    }
    cVar2 = envelope->node_y[bVar1 - 1];
  }
  iVar7 = (int)cVar2 << 8;
LAB_005b6541:
  pe->value = iVar7;
  pe->tick = uVar4 + 1;
  uVar6 = bVar1 - 1;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    do {
      if ((int)uVar4 < (int)(uint)envelope->node_t[uVar5]) {
        uVar6 = (uint)uVar5;
        break;
      }
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  pe->next_node = uVar6;
  if (((envelope->flags & 4) == 0) || ((playing->flags & 2) != 0)) {
    if ((envelope->flags & 2) == 0) {
      if ((int)uVar4 < (int)(uint)envelope->node_t[(ulong)bVar1 - 1]) {
        return 0;
      }
      return 1;
    }
    if ((int)uVar4 < (int)(uint)envelope->node_t[envelope->loop_end]) {
      return 0;
    }
    bVar1 = envelope->loop_start;
  }
  else {
    if ((int)uVar4 < (int)(uint)envelope->node_t[envelope->sus_loop_end]) {
      return 0;
    }
    bVar1 = envelope->sus_loop_start;
  }
  pe->next_node = bVar1 + 1;
  pe->tick = (uint)envelope->node_t[bVar1];
  return 0;
}

Assistant:

static int update_it_envelope(IT_PLAYING *playing, IT_ENVELOPE *envelope, IT_PLAYING_ENVELOPE *pe, int flags)
{
	if (!(playing->enabled_envelopes & flags) || !envelope->n_nodes)
		return 0;

	ASSERT(envelope->n_nodes > 0);

	if (pe->tick <= 0)
		pe->value = envelope->node_y[0] << IT_ENVELOPE_SHIFT;
	else if (pe->tick >= envelope->node_t[envelope->n_nodes-1]) {
		pe->value = envelope->node_y[envelope->n_nodes-1] << IT_ENVELOPE_SHIFT;
	} else {
		int ys = envelope->node_y[pe->next_node-1] << IT_ENVELOPE_SHIFT;
		int ts = envelope->node_t[pe->next_node-1];
		int te = envelope->node_t[pe->next_node];

		if (ts == te)
			pe->value = ys;
		else {
			int ye = envelope->node_y[pe->next_node] << IT_ENVELOPE_SHIFT;
			int t = pe->tick;

			pe->value = ys + (ye - ys) * (t - ts) / (te - ts);
		}
	}

	pe->tick++;

	recalculate_it_envelope_node(pe, envelope);

	if ((envelope->flags & IT_ENVELOPE_SUSTAIN_LOOP) && !(playing->flags & IT_PLAYING_SUSTAINOFF)) {
		if (pe->tick > envelope->node_t[envelope->sus_loop_end]) {
			pe->next_node = envelope->sus_loop_start + 1;
			ASSERT(pe->next_node <= envelope->n_nodes);
			pe->tick = envelope->node_t[envelope->sus_loop_start];
			return 0;
		}
	} else if (envelope->flags & IT_ENVELOPE_LOOP_ON) {
		if (pe->tick > envelope->node_t[envelope->loop_end]) {
			pe->next_node = envelope->loop_start + 1;
			ASSERT(pe->next_node <= envelope->n_nodes);
			pe->tick = envelope->node_t[envelope->loop_start];
			return 0;
		}
	}
	else if (pe->tick > envelope->node_t[envelope->n_nodes - 1])
		return 1;

	return 0;
}